

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchcache.hpp
# Opt level: O1

int __thiscall
CorUnix::CSynchCache<CorUnix::_WaitingThreadsListNode>::Get
          (CSynchCache<CorUnix::_WaitingThreadsListNode> *this,CPalThread *pthrCurrent,int n,
          _WaitingThreadsListNode **ppObjs)

{
  _USynchCacheStackNode *p_Var1;
  _WaitingThreadsListNode *__s;
  ulong uVar2;
  
  InternalEnterCriticalSection(pthrCurrent,&this->m_cs);
  p_Var1 = (this->m_pHead).m_val;
  uVar2 = 0;
  if (0 < n && p_Var1 != (_USynchCacheStackNode *)0x0) {
    uVar2 = 0;
    do {
      ppObjs[uVar2] = (_WaitingThreadsListNode *)p_Var1;
      p_Var1 = p_Var1->next;
      uVar2 = uVar2 + 1;
      if (p_Var1 == (_USynchCacheStackNode *)0x0) break;
    } while (uVar2 < (uint)n);
  }
  (this->m_pHead).m_val = p_Var1;
  (this->m_iDepth).m_val = (this->m_iDepth).m_val - (int)uVar2;
  if (((this->m_pHead).m_val == (_USynchCacheStackNode *)0x0) && ((this->m_iDepth).m_val != 0)) {
    fprintf(_stderr,"SYNCCACHE: Invalid cache depth value");
    DebugBreak();
  }
  InternalLeaveCriticalSection(pthrCurrent,&this->m_cs);
  if ((int)uVar2 < n) {
    uVar2 = uVar2 & 0xffffffff;
    do {
      __s = (_WaitingThreadsListNode *)InternalMalloc(0x40);
      if (__s == (_WaitingThreadsListNode *)0x0) {
        __s = (_WaitingThreadsListNode *)0x0;
      }
      else {
        (__s->ptrOwnerObjSynchData).shrid = 0;
        __s->ptwiWaitInfo = (_ThreadWaitInfo *)0x0;
        __s->dwObjIndex = 0;
        __s->dwFlags = 0;
        __s->shridWaitingState = 0;
        __s->shridSHRThis = 0;
        __s->dwThreadId = 0;
        __s->dwProcessId = 0;
        (__s->ptrNext).shrid = 0;
        (__s->ptrPrev).shrid = 0;
      }
      if (__s == (_WaitingThreadsListNode *)0x0) goto LAB_002cbe26;
      memset(__s,0,0x40);
      ppObjs[uVar2] = __s;
      uVar2 = uVar2 + 1;
    } while ((long)n != uVar2);
    uVar2 = (ulong)(uint)n;
  }
LAB_002cbe26:
  return (int)uVar2;
}

Assistant:

int Get(CPalThread * pthrCurrent, int n, T ** ppObjs)
        {
            void * pvObjRaw;
            USynchCacheStackNode * pNode;
            int i = 0,j;

            Lock(pthrCurrent);
            pNode = m_pHead;
            while (pNode && i < n)
            {
                ppObjs[i] = (T *)pNode;
                pNode = pNode->next;
                i++;
            }
            m_pHead = pNode;
            m_iDepth -= i;

#ifdef _DEBUG
            if (NULL == m_pHead && m_iDepth != 0)
            {
                // Can't use ASSERT here, since this is header
                // is included by other headers with inline methods
                // which causes template instatiation in the header
                // where the DEBUG CHANNEL is not defined and cannot
                // be defined
                fprintf(stderr,"SYNCCACHE: Invalid cache depth value");
                DebugBreak();
            }
#endif // _DEBUG

            Unlock(pthrCurrent);

            for (j=i;j<n;j++)
            {
                pvObjRaw = (void *) InternalNew<USynchCacheStackNode>();
                if (NULL == pvObjRaw)
                    break;
#ifdef _DEBUG
                memset(pvObjRaw, 0, sizeof(USynchCacheStackNode));
#endif
                ppObjs[j] = reinterpret_cast<T*>(pvObjRaw);
            }

            for (i=0;i<j;i++)
            {
                new ((void *)ppObjs[i]) T;
            }

            return j;
        }